

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O0

char * __thiscall
bloaty::CustomDataSource::_InternalParse(CustomDataSource *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  ParseContext *in_RDX;
  string *in_RSI;
  ParseContext *in_RDI;
  uint32 tag;
  HasBits has_bits;
  ParseContext *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  uint in_stack_ffffffffffffffd0;
  HasBits<1UL> in_stack_ffffffffffffffd4;
  ParseContext *p;
  
  p = in_RDI;
  memset(&stack0xffffffffffffffd4,0,4);
LAB_001a5ee2:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done
                      ((ParseContext *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                       ,(char **)in_stack_ffffffffffffffb8);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001a611c;
    in_RSI = (string *)
             google::protobuf::internal::ReadTag
                       ((char *)p,(uint32 *)in_RSI,(uint32)((ulong)in_RDX >> 0x20));
    if (in_RSI == (string *)0x0) goto LAB_001a6139;
    in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffd0 >> 3;
    if (in_stack_ffffffffffffffc4 == 1) {
      if ((in_stack_ffffffffffffffd0 & 0xff) != 10) goto LAB_001a60be;
      _internal_mutable_name_abi_cxx11_((CustomDataSource *)CONCAT44(1,in_stack_ffffffffffffffc0));
      in_RSI = (string *)
               google::protobuf::internal::InlineGreedyStringParserUTF8Verify
                         (in_RSI,(char *)in_RDX,
                          (ParseContext *)
                          CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],in_stack_ffffffffffffffd0)
                          ,(char *)in_RDI);
    }
    else {
      if (in_stack_ffffffffffffffc4 == 2) {
        if ((in_stack_ffffffffffffffd0 & 0xff) == 0x12) {
          _internal_mutable_base_data_source_abi_cxx11_
                    ((CustomDataSource *)CONCAT44(2,in_stack_ffffffffffffffc0));
          in_RSI = (string *)
                   google::protobuf::internal::InlineGreedyStringParserUTF8Verify
                             (in_RSI,(char *)in_RDX,
                              (ParseContext *)
                              CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                       in_stack_ffffffffffffffd0),(char *)in_RDI);
          goto joined_r0x001a6004;
        }
      }
      else if ((in_stack_ffffffffffffffc4 == 3) && ((in_stack_ffffffffffffffd0 & 0xff) == 0x1a)) {
        do {
          in_stack_ffffffffffffffb8 = in_RDX;
          in_RDX = in_stack_ffffffffffffffb8;
          _internal_add_rewrite((CustomDataSource *)0x1a6062);
          in_RSI = (string *)
                   google::protobuf::internal::ParseContext::ParseMessage<bloaty::Regex>
                             (in_RDX,(Regex *)CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                                       in_stack_ffffffffffffffd0),(char *)in_RDI);
          if (in_RSI == (string *)0x0) goto LAB_001a6139;
          bVar1 = google::protobuf::internal::EpsCopyInputStream::DataAvailable
                            (&in_RDX->super_EpsCopyInputStream,(char *)in_RSI);
        } while ((bVar1) &&
                (bVar1 = google::protobuf::internal::ExpectTag<26u>((char *)in_RSI), bVar1));
        goto LAB_001a5ee2;
      }
LAB_001a60be:
      if (((in_stack_ffffffffffffffd0 & 7) == 4) || (in_stack_ffffffffffffffd0 == 0)) {
        google::protobuf::internal::EpsCopyInputStream::SetLastTag
                  (&in_RDX->super_EpsCopyInputStream,in_stack_ffffffffffffffd0);
        goto LAB_001a611c;
      }
      in_RSI = (string *)
               google::protobuf::internal::UnknownFieldParse
                         ((uint32)((ulong)in_RSI >> 0x20),(InternalMetadataWithArena *)in_RDX,
                          (char *)CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                           in_stack_ffffffffffffffd0),in_RDI);
    }
joined_r0x001a6004:
    if (in_RSI == (string *)0x0) {
LAB_001a6139:
      in_RSI = (string *)0x0;
LAB_001a611c:
      google::protobuf::internal::HasBits<1UL>::Or
                ((HasBits<1UL> *)&(in_RDI->super_EpsCopyInputStream).next_chunk_,
                 (HasBits<1UL> *)&stack0xffffffffffffffd4);
      return (char *)in_RSI;
    }
  } while( true );
}

Assistant:

const char* CustomDataSource::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "bloaty.CustomDataSource.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string base_data_source = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_base_data_source(), ptr, ctx, "bloaty.CustomDataSource.base_data_source");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .bloaty.Regex rewrite = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_rewrite(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}